

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O0

void __thiscall
Frame::Frame(Frame *this,int frameId,Mat *projMatL,Mat *projMatR,Mat *worldRotation,
            Mat *worldTranslation)

{
  Mat *worldTranslation_local;
  Mat *worldRotation_local;
  Mat *projMatR_local;
  Mat *projMatL_local;
  int frameId_local;
  Frame *this_local;
  
  cv::Mat::Mat(&this->m_projMatL);
  cv::Mat::Mat(&this->m_projMatR);
  cv::Mat::Mat(&this->m_worldRotation);
  cv::Mat::Mat(&this->m_worldTranslation);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            (&this->m_pointsFeatureLeft);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            (&this->m_pointsFeatureRight);
  cv::Mat::operator=(&this->m_projMatL,projMatL);
  cv::Mat::operator=(&this->m_projMatR,projMatR);
  cv::Mat::operator=(&this->m_worldRotation,worldRotation);
  cv::Mat::operator=(&this->m_worldTranslation,worldTranslation);
  return;
}

Assistant:

Frame::Frame(int frameId, const cv::Mat projMatL, const cv::Mat projMatR, cv::Mat worldRotation, cv::Mat worldTranslation)
{
    m_projMatL = projMatL;
    m_projMatR = projMatR;
    m_worldRotation = worldRotation;
    m_worldTranslation = worldTranslation;

}